

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uiter.cpp
# Opt level: O0

void characterIteratorSetState(UCharIterator *iter,uint32_t state,UErrorCode *pErrorCode)

{
  UBool UVar1;
  int32_t iVar2;
  UErrorCode *pErrorCode_local;
  uint32_t state_local;
  UCharIterator *iter_local;
  
  if ((pErrorCode != (UErrorCode *)0x0) && (UVar1 = U_FAILURE(*pErrorCode), UVar1 == '\0')) {
    if ((iter == (UCharIterator *)0x0) || (iter->context == (void *)0x0)) {
      *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      iVar2 = icu_63::CharacterIterator::startIndex((CharacterIterator *)iter->context);
      if (((int)state < iVar2) ||
         (iVar2 = icu_63::CharacterIterator::endIndex((CharacterIterator *)iter->context),
         iVar2 < (int)state)) {
        *pErrorCode = U_INDEX_OUTOFBOUNDS_ERROR;
      }
      else {
        (**(code **)(*iter->context + 0x78))(iter->context,state);
      }
    }
  }
  return;
}

Assistant:

static void U_CALLCONV
characterIteratorSetState(UCharIterator *iter, uint32_t state, UErrorCode *pErrorCode) {
    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        /* do nothing */
    } else if(iter==NULL || iter->context==NULL) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
    } else if((int32_t)state<((CharacterIterator *)(iter->context))->startIndex() || ((CharacterIterator *)(iter->context))->endIndex()<(int32_t)state) {
        *pErrorCode=U_INDEX_OUTOFBOUNDS_ERROR;
    } else {
        ((CharacterIterator *)(iter->context))->setIndex((int32_t)state);
    }
}